

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O0

void (anonymous_namespace)::
     makeSequence<slang::SmallVector<(anonymous_namespace)::Constructable,4ul>>
               (SmallVector<(anonymous_namespace)::Constructable,_4UL> *v,int start,int end)

{
  int in_EDX;
  int in_ESI;
  SmallVectorBase<(anonymous_namespace)::Constructable> *in_RDI;
  int i;
  Constructable *in_stack_00000060;
  Constructable *in_stack_ffffffffffffffb8;
  SmallVectorBase<(anonymous_namespace)::Constructable> *this;
  Constructable local_1c;
  int local_14;
  int local_10;
  SmallVectorBase<(anonymous_namespace)::Constructable> *local_8;
  
  local_10 = in_EDX;
  local_8 = in_RDI;
  for (local_14 = in_ESI; local_14 <= local_10; local_14 = local_14 + 1) {
    this = local_8;
    anon_unknown.dwarf_70180c::Constructable::Constructable(&local_1c,local_14);
    slang::SmallVectorBase<(anonymous_namespace)::Constructable>::push_back
              (this,in_stack_ffffffffffffffb8);
    anon_unknown.dwarf_70180c::Constructable::~Constructable(in_stack_00000060);
  }
  return;
}

Assistant:

void makeSequence(TVector& v, int start, int end) {
    for (int i = start; i <= end; ++i)
        v.push_back(Constructable(i));
}